

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowCustomAggregatorState::WindowCustomAggregatorState
          (WindowCustomAggregatorState *this,AggregateObject *aggr,WindowExcludeMode exclude_mode)

{
  idx_t __n;
  allocator_type local_89;
  vector<unsigned_char,_true> *local_88;
  AggregateObject *local_80;
  Value local_78;
  
  WindowAggregatorLocalState::WindowAggregatorLocalState(&this->super_WindowAggregatorLocalState);
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowCustomAggregatorState_017afa20;
  AggregateObject::AggregateObject(&this->aggr,aggr);
  local_80 = &this->aggr;
  __n = (*(aggr->function).state_size)(&aggr->function);
  local_88 = &this->state;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__n,
             (allocator_type *)&local_78);
  Value::POINTER(&local_78,
                 (uintptr_t)
                 (this->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  Vector::Vector(&this->statef,&local_78);
  Value::~Value(&local_78);
  local_78.type_.id_ = INVALID;
  local_78.type_.physical_type_ = ~INVALID;
  local_78.type_._2_6_ = 0;
  local_78.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::vector
            (&(this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
             ,3,(value_type *)&local_78,&local_89);
  (*(aggr->function).initialize)
            (&aggr->function,
             (local_88->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  WindowAggregatorLocalState::InitSubFrames(&this->frames,exclude_mode);
  return;
}

Assistant:

WindowCustomAggregatorState::WindowCustomAggregatorState(const AggregateObject &aggr,
                                                         const WindowExcludeMode exclude_mode)
    : aggr(aggr), state(aggr.function.state_size(aggr.function)),
      statef(Value::POINTER(CastPointerToValue(state.data()))), frames(3, {0, 0}) {
	// if we have a frame-by-frame method, share the single state
	aggr.function.initialize(aggr.function, state.data());

	InitSubFrames(frames, exclude_mode);
}